

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-netpack.c
# Opt level: O2

int lpack(lua_State *L)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  void *srcv;
  char *s;
  lua_Integer lVar4;
  size_t sz;
  
  sz = 0;
  iVar3 = 1;
  srcv = getbuffer(L,1,&sz);
  uVar1 = sz + (sz + 0x7ff >> 0xb) * 2;
  s = (char *)lua_touserdata(L,-0xf4629);
  lVar4 = lua_tointegerx(L,-0xf462a,(int *)0x0);
  if ((ulong)(long)(int)lVar4 < uVar1) {
    s = (char *)expand_buffer(L,(int)lVar4,(int)uVar1);
  }
  uVar2 = sproto_pack(srcv,(int)sz,s,(int)uVar1);
  if (uVar1 < (ulong)(long)(int)uVar2) {
    iVar3 = luaL_error(L,"packing error, return size = %d",(ulong)uVar2);
  }
  else {
    lua_pushlstring(L,s,(long)(int)uVar2);
  }
  return iVar3;
}

Assistant:

static int
lpack(lua_State *L) {
	size_t len;
	const char * ptr = tolstring(L, &len, 1);
	if (len > 0x10000) {
		return luaL_error(L, "Invalid size (too long) of data : %d", (int)len);
	}

	uint8_t * buffer = skynet_malloc(len + 2);
	write_size(buffer, len);
	memcpy(buffer+2, ptr, len);

	lua_pushlightuserdata(L, buffer);
	lua_pushinteger(L, len + 2);

	return 2;
}